

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O0

MicroProps * __thiscall
icu_63::number::impl::NumberFormatterImpl::preProcessUnsafe
          (NumberFormatterImpl *this,DecimalQuantity *inValue,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  DecimalQuantity *inValue_local;
  NumberFormatterImpl *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (this->fMicroPropsGenerator == (MicroPropsGenerator *)0x0) {
      *status = U_INTERNAL_PROGRAM_ERROR;
    }
    else {
      (*this->fMicroPropsGenerator->_vptr_MicroPropsGenerator[2])
                (this->fMicroPropsGenerator,inValue,&this->fMicros,status);
      RoundingImpl::apply(&(this->fMicros).rounder,inValue,status);
      IntegerWidth::apply(&(this->fMicros).integerWidth,inValue,status);
    }
  }
  this_local = (NumberFormatterImpl *)&this->fMicros;
  return (MicroProps *)this_local;
}

Assistant:

MicroProps& NumberFormatterImpl::preProcessUnsafe(DecimalQuantity& inValue, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return fMicros; // must always return a value
    }
    if (fMicroPropsGenerator == nullptr) {
        status = U_INTERNAL_PROGRAM_ERROR;
        return fMicros; // must always return a value
    }
    fMicroPropsGenerator->processQuantity(inValue, fMicros, status);
    fMicros.rounder.apply(inValue, status);
    fMicros.integerWidth.apply(inValue, status);
    return fMicros;
}